

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON__UINT32 __thiscall
ON_WindingNumber::AddBoundary
          (ON_WindingNumber *this,size_t point_count,size_t point_stride,double *boundary_points,
          bool bCloseBoundary)

{
  double *q;
  ON__UINT32 OVar1;
  long lVar2;
  double *p;
  
  OVar1 = this->m_boundary_segment_count;
  if ((((boundary_points != (double *)0x0) && (1 < point_stride)) && (1 < point_count)) &&
     (!NAN((this->m_winding_point).x))) {
    lVar2 = (point_count - 1) * point_stride;
    p = boundary_points;
    if (0 < lVar2) {
      do {
        q = p + point_stride;
        Internal_AddBoundarySegment(this,p,q);
        p = q;
      } while (q < boundary_points + lVar2);
    }
    if (bCloseBoundary) {
      Internal_AddBoundarySegment(this,boundary_points + lVar2,boundary_points);
    }
  }
  return this->m_boundary_segment_count - OVar1;
}

Assistant:

ON__UINT32 ON_WindingNumber::AddBoundary(size_t point_count, size_t point_stride, const double* boundary_points, bool bCloseBoundary)
{
  const ON__UINT32 boundary_segment_count0 = m_boundary_segment_count;
  if (Internal_HaveWindingPoint() && point_count >= 2 && point_stride >= 2 && nullptr != boundary_points)
  {
    const double* last_point = boundary_points + ((point_count - 1)*point_stride);
    for (const double* p = boundary_points; p < last_point; p += point_stride)
    {
      Internal_AddBoundarySegment(p, p + point_stride);
    }
    if (bCloseBoundary)
    {
      Internal_AddBoundarySegment(last_point, boundary_points);
    }
  }
  return (m_boundary_segment_count - boundary_segment_count0);
}